

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunadaptcontroller_soderlind.c
# Opt level: O0

SUNErrCode SUNAdaptController_Space_Soderlind(SUNAdaptController C,long *lenrw,long *leniw)

{
  SUNContext_conflict sunctx_local_scope_;
  long *leniw_local;
  long *lenrw_local;
  SUNAdaptController C_local;
  
  *lenrw = 10;
  *leniw = 1;
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Space_Soderlind(SUNAdaptController C,
                                              long int* lenrw, long int* leniw)
{
  SUNFunctionBegin(C->sunctx);
  SUNAssert(lenrw, SUN_ERR_ARG_CORRUPT);
  SUNAssert(leniw, SUN_ERR_ARG_CORRUPT);
  *lenrw = 10;
  *leniw = 1;
  return SUN_SUCCESS;
}